

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_ManRemoveContained(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  Vec_Bit_t *p_00;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  p_00 = Ree_CollectInsiders(p,vAdds);
  lVar8 = 0;
  iVar7 = 0;
  iVar6 = 0;
  do {
    if (vAdds->nSize <= lVar8) {
      if (iVar7 < iVar6) {
        __assert_fail("k <= i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecRe.c"
                      ,0x227,"void Ree_ManRemoveContained(Gia_Man_t *, Vec_Int_t *)");
      }
      Vec_IntShrink(vAdds,iVar6 * 6);
      Vec_BitFree(p_00);
      return;
    }
    iVar5 = (int)lVar8;
    iVar4 = Vec_IntEntry(vAdds,iVar5 + 2);
    if (iVar4 == 0) {
      iVar4 = Vec_IntEntry(vAdds,iVar5 + 3);
      iVar4 = Vec_BitEntry(p_00,iVar4);
      if (iVar4 == 0) goto LAB_00531e58;
      iVar5 = Vec_IntEntry(vAdds,iVar5 + 4);
      iVar5 = Vec_BitEntry(p_00,iVar5);
      if (iVar5 == 0) goto LAB_00531e58;
    }
    else {
LAB_00531e58:
      piVar1 = vAdds->pArray;
      iVar5 = iVar6 * 6;
      iVar6 = iVar6 + 1;
      uVar2 = *(undefined8 *)(piVar1 + lVar8);
      uVar3 = *(undefined8 *)(piVar1 + lVar8 + 2);
      *(undefined8 *)(piVar1 + (long)iVar5 + 4) = *(undefined8 *)(piVar1 + lVar8 + 4);
      *(undefined8 *)(piVar1 + iVar5) = uVar2;
      *(undefined8 *)(piVar1 + iVar5 + 2) = uVar3;
    }
    iVar7 = iVar7 + 1;
    lVar8 = lVar8 + 6;
  } while( true );
}

Assistant:

void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vInsiders = Ree_CollectInsiders( p, vAdds );
    int i, k = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            if ( Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+3)) && Vec_BitEntry(vInsiders, Vec_IntEntry(vAdds, 6*i+4)) )
                continue;
        memmove( Vec_IntArray(vAdds) + 6*k++, Vec_IntArray(vAdds) + 6*i, 6*sizeof(int) );
    }
    assert( k <= i );
    Vec_IntShrink( vAdds, 6*k );
    Vec_BitFree( vInsiders );
}